

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_MAC(ImGuiInputTextState *obj,int idx)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  ImGuiInputTextState *in_RDI;
  bool bVar3;
  int len;
  int local_18;
  
  local_18 = in_ESI + 1;
  iVar1 = in_RDI->CurLenW;
  while( true ) {
    bVar3 = false;
    if (local_18 < iVar1) {
      iVar2 = is_word_boundary_from_left(in_RDI,local_18);
      bVar3 = iVar2 == 0;
    }
    if (!bVar3) break;
    local_18 = local_18 + 1;
  }
  if (iVar1 < local_18) {
    local_18 = iVar1;
  }
  return local_18;
}

Assistant:

static int  STB_TEXTEDIT_MOVEWORDRIGHT_MAC(ImGuiInputTextState* obj, int idx)   { idx++; int len = obj->CurLenW; while (idx < len && !is_word_boundary_from_left(obj, idx)) idx++; return idx > len ? len : idx; }